

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_function.cpp
# Opt level: O1

string * __thiscall
duckdb::PragmaFunction::ToString_abi_cxx11_(string *__return_storage_ptr__,PragmaFunction *this)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params;
  undefined1 *puVar2;
  undefined1 *puVar3;
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  string local_80;
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  string local_40;
  
  if (this->type == PRAGMA_CALL) {
    puVar3 = local_90;
    local_a0[0] = puVar3;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"PRAGMA %s","");
    params = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &(this->super_SimpleNamedParameterFunction).named_parameters;
    Function::CallToString
              (&local_40,
               &(this->super_SimpleNamedParameterFunction).super_SimpleFunction.super_Function.name,
               &(this->super_SimpleNamedParameterFunction).super_SimpleFunction.arguments,
               (named_parameter_type_map_t *)params);
    StringUtil::Format<std::__cxx11::string>
              (__return_storage_ptr__,(StringUtil *)local_a0,&local_40,params);
    puVar2 = local_a0[0];
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
      puVar2 = local_a0[0];
    }
  }
  else {
    if (this->type != PRAGMA_STATEMENT) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,"UNKNOWN","");
      return __return_storage_ptr__;
    }
    puVar3 = local_50;
    local_60[0] = puVar3;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"PRAGMA %s","");
    pcVar1 = (this->super_SimpleNamedParameterFunction).super_SimpleFunction.super_Function.name.
             _M_dataplus._M_p;
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_80,pcVar1,
               pcVar1 + (this->super_SimpleNamedParameterFunction).super_SimpleFunction.
                        super_Function.name._M_string_length);
    StringUtil::Format<std::__cxx11::string>
              (__return_storage_ptr__,(StringUtil *)local_60,&local_80,in_RCX);
    puVar2 = local_60[0];
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
      puVar2 = local_60[0];
    }
  }
  if (puVar2 != puVar3) {
    operator_delete(puVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

string PragmaFunction::ToString() const {
	switch (type) {
	case PragmaType::PRAGMA_STATEMENT:
		return StringUtil::Format("PRAGMA %s", name);
	case PragmaType::PRAGMA_CALL: {
		return StringUtil::Format("PRAGMA %s", SimpleNamedParameterFunction::ToString());
	}
	default:
		return "UNKNOWN";
	}
}